

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

GenericStreamTextBasedSet * __thiscall
ASDCP::MXF::GenericStreamTextBasedSet::WriteToTLVSet
          (GenericStreamTextBasedSet *this,TLVWriter *TLVSet)

{
  int iVar1;
  MDDEntry *value;
  MDDEntry *in_RDX;
  TLVWriter local_a0;
  undefined1 local_21;
  MDDEntry *local_20;
  TLVWriter *TLVSet_local;
  GenericStreamTextBasedSet *this_local;
  Result_t *result;
  
  TLVSet_local = TLVSet;
  this_local = this;
  if (TLVSet[1].super_MemIOWriter.m_p == (byte_t *)0x0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                  ,0x131d,
                  "virtual ASDCP::Result_t ASDCP::MXF::GenericStreamTextBasedSet::WriteToTLVSet(TLVWriter &)"
                 );
  }
  local_21 = 0;
  local_20 = in_RDX;
  TextBasedObject::WriteToTLVSet(&this->super_TextBasedObject,TLVSet);
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar1) {
    value = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                             MDD_GenericStreamTextBasedSet_GenericStreamSID);
    TLVWriter::WriteUi32(&local_a0,local_20,(ui32_t *)value);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_a0);
    Kumu::Result_t::~Result_t((Result_t *)&local_a0);
  }
  return this;
}

Assistant:

ASDCP::Result_t
GenericStreamTextBasedSet::WriteToTLVSet(TLVWriter& TLVSet)
{
  assert(m_Dict);
  Result_t result = TextBasedObject::WriteToTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteUi32(OBJ_WRITE_ARGS(GenericStreamTextBasedSet, GenericStreamSID));
  return result;
}